

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O3

void NetworkDataType::
     deserializedata<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int>
               (binarydata *data,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,int *args_4
               )

{
  unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
  *puVar1;
  pointer pcVar2;
  PortableBinaryInputArchive *pPVar3;
  size_type size;
  PortableBinaryInputArchive archive;
  stringstream stream;
  Options local_2c8;
  undefined7 uStack_2c7;
  int *local_2c0;
  PortableBinaryInputArchive local_2b8;
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  puVar1 = &local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.itsBaseClassSet;
  pcVar2 = (data->str)._M_dataplus._M_p;
  local_2c0 = args_4;
  local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar2,pcVar2 + (data->str)._M_string_length);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_2b8,_S_out|_S_in);
  if ((unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
       *)local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.super_InputArchiveBase
         ._vptr_InputArchiveBase != puVar1) {
    operator_delete(local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                    super_InputArchiveBase._vptr_InputArchiveBase,
                    (long)local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                          itsBaseClassSet._M_h._M_buckets + 1);
  }
  local_2c8.itsInputEndianness = cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (&local_2b8,(istream *)local_1b8,&local_2c8);
  pPVar3 = ((local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.self)->
           super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self;
  cereal::PortableBinaryInputArchive::loadBinary<8ul>
            ((((((((pPVar3->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&local_2c8,8);
  std::__cxx11::string::resize((ulong)args,local_2c8.itsInputEndianness);
  cereal::PortableBinaryInputArchive::loadBinary<1ul>
            ((((pPVar3->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,
             (args->_M_dataplus)._M_p,CONCAT71(uStack_2c7,local_2c8.itsInputEndianness));
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
  process<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&>
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)&local_2b8,args_1,args_2,args_3,
             local_2c0);
  local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_002e7848;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsVersionedTypes._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsPolymorphicTypeMap._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<void>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsSharedPointerMap._M_h);
  std::
  _Hashtable<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id,_std::allocator<cereal::traits::detail::base_class_id>,_std::__detail::_Identity,_std::equal_to<cereal::traits::detail::base_class_id>,_cereal::traits::detail::base_class_id_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2b8.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsBaseClassSet._M_h);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }